

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<Ptex::v2_2::PtexHalf,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ushort *puVar7;
  int iVar8;
  ushort *puVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  iVar8 = k->v1;
  iVar4 = k->v2;
  if (iVar8 != iVar4) {
    fVar1 = k->A;
    do {
      iVar6 = k->rowlen - iVar8;
      iVar5 = iVar6 - k->w2;
      if (iVar5 < k->u1) {
        iVar5 = k->u1;
      }
      iVar6 = iVar6 - k->w1;
      if (k->u2 < iVar6) {
        iVar6 = k->u2;
      }
      if (0 < iVar6 - iVar5) {
        puVar9 = (ushort *)((long)data + (long)((k->rowlen * iVar8 + iVar5) * 4) * 2);
        puVar7 = puVar9 + (iVar6 - iVar5) * 4;
        fVar12 = (float)iVar5 - k->u;
        fVar11 = (float)iVar8 - k->v;
        fVar13 = fVar12 * k->A * fVar12 + (k->B * fVar12 + k->C * fVar11) * fVar11;
        fVar11 = (fVar12 + fVar12 + 1.0) * k->A + fVar11 * k->B;
        do {
          if (fVar13 < 1.0) {
            fVar10 = expf(fVar13 * -6.125);
            fVar10 = fVar10 * k->wscale;
            k->weight = k->weight + fVar10;
            fVar12 = *(float *)(PtexHalf::h2fTable + (ulong)puVar9[3] * 4);
            fVar2 = *(float *)(PtexHalf::h2fTable + (ulong)puVar9[2] * 4);
            fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)puVar9[1] * 4);
            *result = fVar10 * *(float *)(PtexHalf::h2fTable + (ulong)*puVar9 * 4) + *result;
            result[1] = fVar10 * fVar3 + result[1];
            result[2] = fVar10 * fVar2 + result[2];
            result[3] = fVar10 * fVar12 + result[3];
          }
          fVar13 = fVar13 + fVar11;
          fVar11 = fVar11 + fVar1 + fVar1;
          puVar9 = puVar9 + 4;
        } while (puVar9 < puVar7);
        iVar4 = k->v2;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar4);
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }